

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

uint portInfo(snd_seq_t *seq,snd_seq_port_info_t *pinfo,uint type,int portNumber)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  size_t __n;
  ulong uVar5;
  void *__s;
  undefined8 uStack_40;
  ulong local_38;
  
  uStack_40 = 0x1812d4;
  lVar4 = snd_seq_client_info_sizeof();
  lVar4 = -(lVar4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar4);
  *(undefined8 *)((long)&uStack_40 + lVar4) = 0x1812ea;
  __n = snd_seq_client_info_sizeof();
  local_38 = 0;
  *(undefined8 *)((long)&uStack_40 + lVar4) = 0x1812ff;
  memset(__s,0,__n);
  *(undefined8 *)((long)&uStack_40 + lVar4) = 0xffffffffffffffff;
  uVar1 = *(undefined8 *)((long)&uStack_40 + lVar4);
  *(undefined8 *)((long)&uStack_40 + lVar4) = 0x18130a;
  snd_seq_client_info_set_client(__s,uVar1);
  do {
    do {
      *(undefined8 *)((long)&uStack_40 + lVar4) = 0x181315;
      iVar2 = snd_seq_query_next_client(seq,__s);
      if (iVar2 < 0) {
        return portNumber >> 0x1f & (uint)local_38;
      }
      *(undefined8 *)((long)&uStack_40 + lVar4) = 0x181321;
      iVar2 = snd_seq_client_info_get_client(__s);
    } while (iVar2 == 0);
    *(undefined8 *)((long)&uStack_40 + lVar4) = 0x18132f;
    snd_seq_port_info_set_client(pinfo,iVar2);
    *(undefined8 *)((long)&uStack_40 + lVar4) = 0xffffffffffffffff;
    uVar1 = *(undefined8 *)((long)&uStack_40 + lVar4);
    *(undefined8 *)((long)&uStack_40 + lVar4) = 0x18133a;
    snd_seq_port_info_set_port(pinfo,uVar1);
    while( true ) {
      *(undefined8 *)((long)&uStack_40 + lVar4) = 0x181345;
      iVar2 = snd_seq_query_next_port(seq,pinfo);
      if (iVar2 < 0) break;
      *(undefined8 *)((long)&uStack_40 + lVar4) = 0x181351;
      uVar5 = snd_seq_port_info_get_type(pinfo);
      if ((uVar5 & 0x100402) != 0) {
        *(undefined8 *)((long)&uStack_40 + lVar4) = 0x181360;
        uVar3 = snd_seq_port_info_get_capability(pinfo);
        if (((type & ~uVar3) == 0) &&
           (iVar2 = (int)local_38, local_38 = (ulong)(iVar2 + 1), iVar2 == portNumber)) {
          *(undefined8 *)((long)&uStack_40 + lVar4) = 1;
          return (uint)*(undefined8 *)((long)&uStack_40 + lVar4);
        }
      }
    }
  } while( true );
}

Assistant:

unsigned int portInfo( snd_seq_t *seq, snd_seq_port_info_t *pinfo, unsigned int type, int portNumber )
{
  snd_seq_client_info_t *cinfo;
  int client;
  int count = 0;
  snd_seq_client_info_alloca( &cinfo );

  snd_seq_client_info_set_client( cinfo, -1 );
  while ( snd_seq_query_next_client( seq, cinfo ) >= 0 ) {
    client = snd_seq_client_info_get_client( cinfo );
    if ( client == 0 ) continue;
    // Reset query info
    snd_seq_port_info_set_client( pinfo, client );
    snd_seq_port_info_set_port( pinfo, -1 );
    while ( snd_seq_query_next_port( seq, pinfo ) >= 0 ) {
      unsigned int atyp = snd_seq_port_info_get_type( pinfo );
      if ( ( ( atyp & SND_SEQ_PORT_TYPE_MIDI_GENERIC ) == 0 ) &&
           ( ( atyp & SND_SEQ_PORT_TYPE_SYNTH ) == 0 ) &&
           ( ( atyp & SND_SEQ_PORT_TYPE_APPLICATION ) == 0 ) ) continue;

      unsigned int caps = snd_seq_port_info_get_capability( pinfo );
      if ( ( caps & type ) != type ) continue;
      if ( count == portNumber ) return 1;
      ++count;
    }
  }

  // If a negative portNumber was used, return the port count.
  if ( portNumber < 0 ) return count;
  return 0;
}